

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageloader.cpp
# Opt level: O3

Function *
stackjit::AssemblyImageLoader::loadFunctionDefinition
          (Function *__return_storage_ptr__,BinaryData *data,size_t *index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  byte bVar3;
  pointer pcVar4;
  ulong uVar5;
  Function *this;
  undefined8 *puVar6;
  unsigned_long uVar7;
  bool *pbVar8;
  string *psVar9;
  size_t *index_00;
  ulong uVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  string returnType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  Function *function;
  string memberFunctionName;
  string className;
  string name;
  string local_118;
  undefined1 local_f8 [32];
  Function *local_d8;
  size_t *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  pcVar4 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = *index;
  uVar10 = (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar4;
  uVar11 = uVar5;
  local_d8 = __return_storage_ptr__;
  if (uVar10 <= uVar5) {
LAB_0015c0f3:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11);
  }
  bVar2 = pcVar4[uVar5];
  uVar11 = uVar5 + 1;
  *index = uVar11;
  if (uVar10 <= uVar11) goto LAB_0015c0f3;
  bVar3 = pcVar4[uVar5 + 1];
  *index = uVar5 + 2;
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  index_00 = (size_t *)local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  local_d0 = index_00;
  if ((bool)(bVar3 & 1) == false) {
    (anonymous_namespace)::loadString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_118);
    _Var12._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0015bec3;
  }
  else {
    (anonymous_namespace)::loadString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_118);
    paVar1 = &local_118.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    (anonymous_namespace)::loadString_abi_cxx11_
              (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    local_f8._0_8_ = (pointer)(local_f8 + 0x10);
    std::__cxx11::string::_M_construct<char*>((string *)local_f8,local_b0,local_b0 + local_a8);
    std::__cxx11::string::append(local_f8);
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_f8,(ulong)local_d0);
    index_00 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)index_00) {
      local_118.field_2._M_allocated_capacity = *index_00;
      local_118.field_2._8_8_ = puVar6[3];
      local_118._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_118.field_2._M_allocated_capacity = *index_00;
      local_118._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_118._M_string_length = puVar6[1];
    *puVar6 = index_00;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar1) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    _Var12._M_p = (pointer)local_f8._0_8_;
    if ((pointer)local_f8._0_8_ == (pointer)(local_f8 + 0x10)) goto LAB_0015bec3;
  }
  operator_delete(_Var12._M_p);
LAB_0015bec3:
  uVar7 = anon_unknown_4::loadData<unsigned_long>
                    ((anon_unknown_4 *)
                     (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (BinaryData *)
                     (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,index);
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_f8._16_8_ = (pointer)0x0;
  if (uVar7 != 0) {
    do {
      (anonymous_namespace)::loadString_abi_cxx11_
                (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_f8,
                 &local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  (anonymous_namespace)::loadString_abi_cxx11_
            (&local_118,(_anonymous_namespace_ *)data,(BinaryData *)index,index_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_90,local_90 + local_88);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  Loader::Function::Function
            (local_d8,&local_50,&local_70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,(bool)(bVar2 & 1));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this = local_d8;
  pbVar8 = Loader::Function::isMemberFunction(local_d8);
  *pbVar8 = (bool)(bVar3 & 1);
  psVar9 = Loader::Function::className_abi_cxx11_(this);
  std::__cxx11::string::_M_assign((string *)psVar9);
  psVar9 = Loader::Function::memberFunctionName_abi_cxx11_(this);
  std::__cxx11::string::_M_assign((string *)psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  if (local_d0 != (size_t *)local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return this;
}

Assistant:

Loader::Function AssemblyImageLoader::loadFunctionDefinition(BinaryData& data, std::size_t& index) {
		auto isExternal = loadData<bool>(data, index);
		auto isMemberFunction = loadData<bool>(data, index);

		std::string name;
		std::string className;
		std::string memberFunctionName;
		if (isMemberFunction) {
			className = loadString(data, index);
			memberFunctionName = loadString(data, index);
			name = className + "::" + memberFunctionName;
		} else {
			name = loadString(data, index);
		}

		auto numParameters = loadData<std::size_t>(data, index);
		std::vector<std::string> parameters;
		for (std::size_t i = 0; i < numParameters; i++) {
			parameters.push_back(loadString(data, index));
		}

		auto returnType = loadString(data, index);

		Loader::Function function(name, returnType, parameters, isExternal);
		function.isMemberFunction() = isMemberFunction;
		function.className() = className;
		function.memberFunctionName() = memberFunctionName;
		return function;
	}